

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  curl_trc_feat *pcVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  Curl_cwriter *pCVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  Curl_cwtype **ppCVar12;
  Curl_cwtype *cwt;
  ulong max;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  Curl_cwriter *writer;
  Curl_cwriter *local_48;
  char *local_40;
  ulong local_38;
  
  bVar14 = is_transfer == 0;
  local_38 = (ulong)bVar14;
  pcVar9 = "content";
  if (!bVar14) {
    pcVar9 = "transfer";
  }
  local_40 = (char *)0x0;
LAB_0011c9d1:
  while ((uVar6 = (ulong)(byte)*enclist, uVar6 < 0x2d &&
         ((0x100100000200U >> (uVar6 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  uVar10 = 1;
  max = 0;
  pbVar13 = (byte *)enclist;
  do {
    bVar3 = (byte)uVar6;
    uVar11 = (uint)uVar6;
    if (uVar11 < 0x20) {
      if (uVar11 != 9) {
        if (uVar11 != 0) goto LAB_0011ca0e;
        break;
      }
    }
    else if (uVar11 != 0x20) {
      if (uVar11 == 0x2c) break;
LAB_0011ca0e:
      if (3 < (byte)(bVar3 - 10)) {
        max = uVar10;
      }
    }
    uVar6 = (ulong)pbVar13[1];
    pbVar13 = pbVar13 + 1;
    uVar10 = uVar10 + 1;
  } while( true );
  if (max == 0) goto LAB_0011cca7;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar9,max & 0xffffffff,enclist);
  }
  if (max == 7 && is_transfer != 0) {
    iVar4 = curl_strnequal(enclist,"chunked",7);
    bVar15 = iVar4 != 0;
    uVar6 = *(ulong *)&(data->set).field_0x8ca;
LAB_0011cabb:
    if ((((uint)uVar6 >> 0x16 & 1) == 0) && (!bVar15)) {
LAB_0011ccba:
      if (((uint)uVar6 >> 0x1c & 1) == 0) {
        return CURLE_OK;
      }
      pcVar1 = (data->state).feat;
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return CURLE_OK;
      }
      if (0 < Curl_trc_feat_write.log_level) {
        Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    sVar7 = Curl_cwriter_count(data,CURL_CW_TRANSFER_DECODE);
    if (sVar7 - 4 < 0xfffffffffffffffb) {
LAB_0011ccfe:
      Curl_failf(data,"Reject response due to more than %u content encodings",5);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar4 = curl_strnequal(enclist,"chunked",max);
    pcVar2 = local_40;
    if ((iVar4 == 0) || ("CONNECT responded chunked"[max + 0x12] != '\0')) {
      if ((local_40 == (char *)0x0) ||
         ((iVar4 = curl_strnequal(enclist,local_40,max), iVar4 == 0 ||
          (cwt = &Curl_httpchunk_unencoder, pcVar2[max] != '\0')))) goto LAB_0011cb5f;
    }
    else {
      cwt = &Curl_httpchunk_unencoder;
    }
LAB_0011cbd6:
    if (!bVar15) {
      bVar15 = false;
      goto LAB_0011cbf3;
    }
    pCVar8 = Curl_cwriter_get_by_type(data,cwt);
    if (pCVar8 != (Curl_cwriter *)0x0) {
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x8cd & 0x10) != 0) {
        pcVar1 = (data->state).feat;
        if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
          return CURLE_OK;
        }
        if (0 < Curl_trc_feat_write.log_level) {
          Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
          return CURLE_OK;
        }
        return CURLE_OK;
      }
      return CURLE_OK;
    }
  }
  else {
    uVar6 = *(ulong *)&(data->set).field_0x8ca;
    if (is_transfer != 0) {
      bVar15 = false;
      goto LAB_0011cabb;
    }
    if ((uVar6 >> 0x23 & 1) != 0) goto LAB_0011ccba;
    sVar7 = Curl_cwriter_count(data,CURL_CW_CONTENT_DECODE);
    if (sVar7 - 4 < 0xfffffffffffffffb) goto LAB_0011ccfe;
    bVar15 = false;
LAB_0011cb5f:
    ppCVar12 = general_unencoders;
    cwt = &identity_encoding;
    do {
      ppCVar12 = ppCVar12 + 1;
      iVar4 = curl_strnequal(enclist,cwt->name,max);
      if (((iVar4 != 0) && (cwt->name[max] == '\0')) ||
         ((cwt->alias != (char *)0x0 &&
          ((iVar4 = curl_strnequal(enclist,cwt->alias,max), iVar4 != 0 && (cwt->alias[max] == '\0'))
          )))) goto LAB_0011cbd6;
      cwt = *ppCVar12;
    } while (cwt != (Curl_cwtype *)0x0);
    cwt = &error_writer;
LAB_0011cbf3:
    if ((!bVar15 && (local_38 & 1) == 0) &&
       (pCVar8 = Curl_cwriter_get_by_name(data,"chunked"), pCVar8 != (Curl_cwriter *)0x0)) {
      Curl_failf(data,"Reject response due to \'chunked\' not being the last Transfer-Encoding");
      return CURLE_BAD_CONTENT_ENCODING;
    }
  }
  CVar5 = Curl_cwriter_create(&local_48,data,cwt,bVar14 + 1 + (uint)bVar14);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"added %s decoder %s -> %d",pcVar9,cwt->name,(ulong)CVar5);
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  CVar5 = Curl_cwriter_add(data,local_48);
  if (CVar5 != CURLE_OK) {
    Curl_cwriter_free(data,local_48);
    return CVar5;
  }
  bVar3 = *pbVar13;
LAB_0011cca7:
  enclist = (char *)pbVar13;
  if (bVar3 == 0) {
    return CURLE_OK;
  }
  goto LAB_0011c9d1;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}